

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O2

int stbi_hdr_test_file(FILE *f)

{
  int iVar1;
  long lVar2;
  undefined1 local_48 [8];
  stbi s;
  
  lVar2 = ftell((FILE *)f);
  s._8_8_ = f;
  iVar1 = hdr_test((stbi *)local_48);
  fseek((FILE *)f,(long)(int)lVar2,0);
  return iVar1;
}

Assistant:

int stbi_hdr_test_file(FILE *f)
{
   stbi s;
   int r,n = ftell(f);
   start_file(&s, f);
   r = hdr_test(&s);
   fseek(f,n,SEEK_SET);
   return r;
}